

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str_to_revision.cpp
# Opt level: O0

void __thiscall
StrToRevision_PositiveOverflow_Test::TestBody(StrToRevision_PositiveOverflow_Test *this)

{
  bool bVar1;
  uint uVar2;
  char *message;
  AssertHelper local_1e8;
  Message local_1e0;
  maybe<unsigned_int,_void> local_1d8;
  string local_1d0;
  maybe<unsigned_int,_void> local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar;
  ostringstream local_188 [8];
  ostringstream str;
  StrToRevision_PositiveOverflow_Test *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  uVar2 = std::numeric_limits<unsigned_int>::max();
  std::ostream::operator<<(local_188,(ulong)uVar2 + 1);
  std::__cxx11::ostringstream::str();
  pstore::str_to_revision(&local_1b0,&local_1d0);
  pstore::nothing<unsigned_int>();
  testing::internal::EqHelper::
  Compare<pstore::maybe<unsigned_int,_void>,_pstore::maybe<unsigned_int,_void>,_nullptr>
            ((EqHelper *)local_1a8,"pstore::str_to_revision (str.str ())",
             "pstore::nothing<unsigned> ()",&local_1b0,&local_1d8);
  pstore::maybe<unsigned_int,_void>::~maybe(&local_1d8);
  pstore::maybe<unsigned_int,_void>::~maybe(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_str_to_revision.cpp"
               ,0x53,message);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

TEST (StrToRevision, PositiveOverflow) {
    std::ostringstream str;
    str << std::numeric_limits<unsigned>::max () + 1ULL;
    EXPECT_EQ (pstore::str_to_revision (str.str ()), pstore::nothing<unsigned> ());
}